

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

size_t __thiscall Bstrlib::String::getUnicodeLength(String *this)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  byte *pbVar4;
  byte *pbVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  pbVar4 = (this->super_tagbstring).data;
  iVar2 = (this->super_tagbstring).slen;
  bVar1 = *pbVar4;
  uVar6 = 0;
  if ((char)bVar1 < '\0') {
    if ((bVar1 & 0x40) == 0) {
      return 0;
    }
    uVar7 = 0x40;
    do {
      uVar6 = uVar6 + 1;
      uVar7 = uVar7 >> 1;
    } while ((uVar7 & bVar1) != 0);
  }
  else {
    uVar6 = (uint)(bVar1 != 0);
  }
  if (iVar2 < 1 || uVar6 == 0) {
    return 0;
  }
  pbVar5 = pbVar4 + iVar2;
  sVar3 = 0;
  while( true ) {
    sVar3 = sVar3 + 1;
    bVar1 = pbVar4[(int)uVar6];
    if ((char)bVar1 < '\0') {
      if ((bVar1 & 0x40) == 0) {
        return sVar3;
      }
      uVar8 = 0x40;
      uVar7 = 0;
      do {
        uVar7 = uVar7 + 1;
        uVar8 = uVar8 >> 1;
      } while ((uVar8 & bVar1) != 0);
    }
    else {
      uVar7 = (uint)(bVar1 != 0);
    }
    if (uVar7 == 0) break;
    pbVar4 = pbVar4 + (int)uVar6;
    uVar6 = uVar7;
    if (pbVar5 <= pbVar4) {
      return sVar3;
    }
  }
  return sVar3;
}

Assistant:

size_t String::getUnicodeLength() const
    {
        size_t size = 0;
        unsigned char * array = data, * end = data + slen;
        int cnt = getUnicodeCharCount(&array[size]);
        while (cnt && array < end)
        {
            size ++;
            array += cnt;
            cnt = getUnicodeCharCount(array);
        }
        return size;
    }